

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O0

void __thiscall
hypermind::CompileUnit::EmitCall(CompileUnit *this,HMInteger methodIndex,HMInteger argNum)

{
  HMInteger argNum_local;
  HMInteger methodIndex_local;
  CompileUnit *this_local;
  
  this->mStackSlotNum = this->mStackSlotNum - argNum;
  if (this->mFn->maxStackSlotNum < this->mStackSlotNum) {
    this->mFn->maxStackSlotNum = this->mStackSlotNum;
  }
  if (argNum < 8) {
    WriteByte(this,(char)argNum + '\x10');
    WriteShortOperand(this,methodIndex);
  }
  else {
    WriteOpcode(this,Call);
    WriteShortOperand(this,methodIndex);
    WriteShortOperand(this,argNum);
  }
  return;
}

Assistant:

void EmitCall(HMInteger methodIndex, HMInteger argNum) {
            STACK_CHANGE(-argNum);
            if (argNum <= 7) {
                WriteByte(static_cast<HMByte>((HMByte) Opcode::Call0 + argNum));
                WriteShortOperand(methodIndex);
            } else {
                WriteOpcode(Opcode::Call);
                WriteShortOperand(methodIndex); // 方法索引
                WriteShortOperand(argNum); // 实参数量
            }
        }